

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::RuleBasedNumberFormat::getRuleSetName
          (UnicodeString *__return_storage_ptr__,RuleBasedNumberFormat *this,int32_t index)

{
  LocalizationInfo *pLVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  NFRuleSet *pNVar5;
  NFRuleSet **ppNVar6;
  bool bVar7;
  bool bVar8;
  ConstChar16Ptr local_38 [3];
  
  pLVar1 = this->localizations;
  if (pLVar1 == (LocalizationInfo *)0x0) {
    ppNVar6 = this->fRuleSets;
    if (ppNVar6 != (NFRuleSet **)0x0) {
      (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
           (_func_int **)&PTR__UnicodeString_003b5258;
      (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
      pNVar5 = *ppNVar6;
      bVar8 = pNVar5 == (NFRuleSet *)0x0;
      if (bVar8) {
        bVar3 = false;
      }
      else {
        bVar3 = false;
        do {
          ppNVar6 = ppNVar6 + 1;
          bVar2 = true;
          if ((pNVar5->fIsPublic != '\0') && (bVar7 = index == 0, index = index + -1, bVar7)) {
            bVar2 = false;
            UnicodeString::copyFrom(__return_storage_ptr__,&pNVar5->name,'\0');
            index = -1;
            bVar3 = true;
          }
          if (!bVar2) break;
          pNVar5 = *ppNVar6;
          bVar8 = pNVar5 == (NFRuleSet *)0x0;
        } while (!bVar8);
      }
      if (!bVar3) {
        UnicodeString::~UnicodeString(__return_storage_ptr__);
      }
      if (!bVar8) {
        return __return_storage_ptr__;
      }
    }
    (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
         (_func_int **)&PTR__UnicodeString_003b5258;
    (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
  }
  else {
    iVar4 = (*pLVar1->_vptr_LocalizationInfo[4])(pLVar1,(ulong)(uint)index);
    local_38[0].p_ = (char16_t *)CONCAT44(extraout_var,iVar4);
    UnicodeString::UnicodeString(__return_storage_ptr__,'\x01',local_38,-1);
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString
RuleBasedNumberFormat::getRuleSetName(int32_t index) const
{
    if (localizations) {
        UnicodeString string(TRUE, localizations->getRuleSetName(index), (int32_t)-1);
        return string;
    }
    else if (fRuleSets) {
        UnicodeString result;
        for (NFRuleSet** p = fRuleSets; *p; ++p) {
            NFRuleSet* rs = *p;
            if (rs->isPublic()) {
                if (--index == -1) {
                    rs->getName(result);
                    return result;
                }
            }
        }
    }
    UnicodeString empty;
    return empty;
}